

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *vecidx,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *rhs,int *rhsidx,int rhsn)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  bool bVar2;
  type_conflict5 tVar3;
  long in_RCX;
  long in_RDX;
  cpp_dec_float<50U,_int,_void> *in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  long in_R8;
  int *in_R9;
  int in_stack_00000008;
  int m;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rval;
  int *idx;
  int *rbeg;
  int *rlen;
  int *ridx;
  int *cperm;
  int *corig;
  int *rorig;
  int c;
  int r;
  int n;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb90;
  undefined1 local_43c [20];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbd8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbe0;
  undefined1 local_404 [56];
  undefined1 local_3cc [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_394;
  undefined1 local_35c [56];
  undefined4 local_324;
  int local_320;
  undefined1 local_31c [56];
  undefined1 local_2e4 [56];
  undefined4 local_2ac;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  int *local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  undefined1 local_248 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_210;
  int *local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  undefined8 local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  undefined4 *local_180;
  long local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  long local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  long local_f8;
  long local_f0;
  undefined1 *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  long local_d8;
  long local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  undefined4 *local_c0;
  undefined1 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_190 = &local_210;
  local_1d8 = in_R9;
  local_1d0 = in_R8;
  local_1c8 = in_RCX;
  local_1c0 = in_RDX;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RSI);
  local_188 = local_248;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RSI);
  local_268 = *(long *)(in_RDI[5].m_backend.data._M_elems + 4);
  local_270 = *(long *)(in_RDI[5].m_backend.data._M_elems + 8);
  local_278._0_4_ = in_RDI[5].m_backend.exp;
  local_278._4_1_ = in_RDI[5].m_backend.neg;
  local_278._5_3_ = *(undefined3 *)&in_RDI[5].m_backend.field_0x2d;
  local_24c = 0;
  while (local_24c < in_stack_00000008) {
    enQueueMin(local_1d8,&local_24c,*(int *)(local_278 + (long)local_1d8[local_24c] * 4));
  }
  local_280._0_4_ = in_RDI[9].m_backend.fpclass;
  local_280._4_4_ = in_RDI[9].m_backend.prec_elem;
  local_2a0 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x369ba1);
  local_288 = *(long *)(in_RDI[10].m_backend.data._M_elems + 2);
  local_290 = *(long *)in_RDI[10].m_backend.data._M_elems;
  local_258 = 0;
  while (0 < in_stack_00000008) {
    local_24c = deQueueMin(local_1d8,&stack0x00000008);
    local_260 = *(int *)(local_270 + (long)local_24c * 4);
    local_d0 = local_1d0 + (long)local_260 * 0x38;
    local_c8 = &local_210;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_RSI,in_stack_fffffffffffffb68);
    local_2ac = 0;
    local_178 = local_1d0 + (long)local_260 * 0x38;
    local_180 = &local_2ac;
    local_c0 = local_180;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_RSI,(long_long_type)in_stack_fffffffffffffb68);
    local_168 = local_2e4;
    local_170 = &local_210;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_RSI,in_stack_fffffffffffffb68);
    local_158 = local_31c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_RSI,in_stack_fffffffffffffb68);
    bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    if (bVar2) {
      local_25c = *(int *)(local_268 + (long)local_24c * 4);
      *(int *)(local_1c8 + (long)local_258 * 4) = local_25c;
      local_258 = local_258 + 1;
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    *)(in_RDI[8].m_backend.data._M_elems + 4),(long)local_25c);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator*=(in_stack_fffffffffffffb90,
                   (self_type *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      local_d8 = local_1c0 + (long)local_25c * 0x38;
      local_e0 = &local_210;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_RSI,in_stack_fffffffffffffb68);
      local_254 = *(int *)(local_290 + (long)local_25c * 4);
      local_298 = (int *)(local_280 + (long)local_254 * 4);
      local_2a8 = local_2a0 + local_254;
      for (local_320 = *(int *)(local_288 + (long)local_25c * 4); local_320 != 0;
          local_320 = local_320 + -1) {
        local_250 = *local_298;
        local_f0 = local_1d0 + (long)local_250 * 0x38;
        local_e8 = local_248;
        local_298 = local_298 + 1;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_RSI,in_stack_fffffffffffffb68);
        local_324 = 0;
        tVar3 = boost::multiprecision::operator==(in_RDI,(int *)in_RSI);
        pnVar1 = local_2a8;
        if (tVar3) {
          local_20 = &local_394;
          local_28 = &local_210;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_29,local_28);
          local_10 = &local_394;
          local_18 = local_28;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_RSI,in_stack_fffffffffffffb68);
          local_8 = &local_394;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(in_RSI);
          pnVar1 = local_2a8;
          local_58 = local_35c;
          local_60 = &local_394;
          local_68 = local_2a8;
          local_2a8 = local_2a8 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_69,local_60,pnVar1);
          local_50 = local_35c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RSI);
          local_38 = local_35c;
          local_40 = local_60;
          local_48 = local_68;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (in_RSI,in_stack_fffffffffffffb68,(cpp_dec_float<50U,_int,_void> *)0x36a052);
          local_108 = local_248;
          local_110 = local_35c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_RSI,in_stack_fffffffffffffb68);
          local_148 = local_3cc;
          local_150 = local_248;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_RSI,in_stack_fffffffffffffb68);
          local_138 = local_404;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    (in_RSI,in_stack_fffffffffffffb68);
          bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          if (bVar2) {
            local_f8 = local_1d0 + (long)local_250 * 0x38;
            local_100 = local_248;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (in_RSI,in_stack_fffffffffffffb68);
            enQueueMin(local_1d8,&stack0x00000008,*(int *)(local_278 + (long)local_250 * 4));
          }
        }
        else {
          local_98 = local_43c;
          local_a0 = &local_210;
          local_a8 = local_2a8;
          local_2a8 = local_2a8 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_a9,local_a0,pnVar1);
          local_90 = local_43c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RSI);
          local_78 = local_43c;
          local_80 = local_a0;
          local_88 = local_a8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (in_RSI,in_stack_fffffffffffffb68,(cpp_dec_float<50U,_int,_void> *)0x36a237);
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=(in_stack_fffffffffffffb90,
                       (self_type *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
          in_stack_fffffffffffffb88 = 0;
          tVar3 = boost::multiprecision::operator!=(in_RDI,(int *)in_RSI);
          if (tVar3) {
            local_128 = &stack0xfffffffffffffb8c;
            local_130 = local_248;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      (in_RSI,in_stack_fffffffffffffb68);
          }
          else {
            local_198 = &stack0xfffffffffffffb8c;
            local_1a0 = &stack0xfffffffffffffb80;
            local_1a8 = 0;
            local_b8 = local_1a0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)0x2b2bff2ee48e0530,(double)in_RDI,in_RSI);
          }
          local_118 = local_1d0 + (long)local_250 * 0x38;
          local_120 = &stack0xfffffffffffffb8c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_RSI,in_stack_fffffffffffffb68);
        }
      }
    }
  }
  return local_258;
}

Assistant:

int CLUFactor<R>::solveUleft(R eps,
                             R* vec, int* vecidx,
                             R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, n, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   n = 0;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         vecidx[n++] = r;
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}